

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_tctable_lite.cc
# Opt level: O1

char * google::protobuf::internal::TcParser::MpRepeatedMessageOrGroup<true,false>
                 (MessageLite *msg,char *ptr,ParseContext *ctx,TcFieldData data,
                 TcParseTableBase *table,uint64_t hasbits)

{
  byte bVar1;
  ushort uVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  uint uVar6;
  int iVar7;
  void *pvVar8;
  RepeatedPtrFieldBase *pRVar9;
  MessageLite *msg_00;
  ushort *p_00;
  char *pcVar10;
  string *psVar11;
  TailCallParseFunc UNRECOVERED_JUMPTABLE;
  ulong uVar12;
  anon_union_8_1_898a9ca8_for_TcFieldData_0 aVar13;
  undefined8 extraout_RDX;
  ulong extraout_RDX_00;
  ulong extraout_RDX_01;
  ulong extraout_RDX_02;
  uint *puVar14;
  char *p;
  ParseContext *ptr_00;
  ParseContext *pPVar15;
  Arena *arena;
  long *plVar16;
  uint uVar17;
  pair<const_char_*,_unsigned_int> pVar18;
  anon_union_8_1_898a9ca8_for_TcFieldData_0 local_68;
  int local_4c;
  int local_48;
  ParseContext *local_38;
  
  puVar14 = (uint *)((long)&table->has_bits_offset + ((ulong)data.field_0 >> 0x20));
  if (((ulong)puVar14 & 3) != 0) {
    AlignFail(puVar14);
  }
  uVar2 = *(ushort *)((long)puVar14 + 10);
  if ((ulong)(uVar2 & 0x30) == 0x20) {
    psVar11 = (string *)0x0;
  }
  else {
    psVar11 = absl::lts_20240722::log_internal::MakeCheckOpString<long,long>
                        ((ulong)(uVar2 & 0x30),0x20,
                         "type_card & field_layout::kFcMask == static_cast<uint16_t>(field_layout::kFcRepeated)"
                        );
  }
  if (psVar11 == (string *)0x0) {
    if ((uVar2 & 0x1c0) == 0) {
      psVar11 = (string *)0x0;
    }
    else {
      psVar11 = absl::lts_20240722::log_internal::MakeCheckOpString<long,long>
                          ((ulong)uVar2 & 0x1c0,0,
                           "type_card & field_layout::kRepMask == static_cast<uint16_t>(field_layout::kRepMessage)"
                          );
    }
    if (psVar11 == (string *)0x0) {
      if ((data.field_0._0_4_ & 7) != 2) {
        UNRECOVERED_JUMPTABLE = table->fallback;
LAB_002a6c06:
        pcVar10 = (*UNRECOVERED_JUMPTABLE)(msg,ptr,ctx,data,table,hasbits);
        return pcVar10;
      }
      pvVar8 = MaybeGetSplitBase(msg,true,table);
      plVar16 = (long *)((ulong)*puVar14 + (long)pvVar8);
      if (((ulong)plVar16 & 7) != 0) {
        AlignFail(plVar16);
      }
      if ((undefined1 *)*plVar16 == kZeroBuffer) {
        arena = (Arena *)(msg->_internal_metadata_).ptr_;
        if (((ulong)arena & 1) != 0) {
          arena = *(Arena **)((ulong)arena & 0xfffffffffffffffe);
        }
        pRVar9 = Arena::CreateArenaCompatible<google::protobuf::internal::RepeatedPtrFieldBase>
                           (arena);
        *plVar16 = (long)pRVar9;
      }
      local_38 = (ParseContext *)*plVar16;
      local_68 = *(anon_union_8_1_898a9ca8_for_TcFieldData_0 *)
                  ((long)&table->has_bits_offset +
                  (ulong)(ushort)puVar14[2] * 8 + (ulong)table->aux_offset);
      uVar17 = uVar2 >> 9 & 3;
      if ((short)uVar17 != 2) {
        if ((uVar2 >> 9 & 3) == 0) {
          MpRepeatedMessageOrGroup<true,false>((TcParser *)&stack0xffffffffffffffb8);
          goto LAB_002a6d30;
        }
        if (uVar17 != 1) {
          local_68.data = *local_68.data;
        }
        local_68.data = (uint64_t)MessageLite::GetTcParseTable(local_68.data);
      }
      do {
        ptr_00 = local_38;
        msg_00 = AddMessage((TcParseTableBase *)local_68,(RepeatedPtrFieldBase *)local_38);
        pVar18._8_8_ = extraout_RDX;
        pVar18.first = (char *)msg_00;
        bVar1 = (byte)*(ushort *)ptr;
        aVar13.data._1_7_ = 0;
        aVar13.data._0_1_ = bVar1;
        if ((char)bVar1 < '\0') {
          ptr_00 = (ParseContext *)(ulong)(uint)bVar1;
          pVar18 = (pair<const_char_*,_unsigned_int>)ReadSizeFallback(ptr,(uint)bVar1);
          pPVar15 = (ParseContext *)pVar18.first;
          aVar13.data = pVar18._8_8_ & 0xffffffff;
        }
        else {
          pPVar15 = (ParseContext *)((long)ptr + 1);
        }
        if ((pPVar15 == (ParseContext *)0x0) || (ctx->depth_ < 1)) {
          pPVar15 = (ParseContext *)0x0;
        }
        else {
          ptr_00 = ctx;
          EpsCopyInputStream::PushLimit
                    ((EpsCopyInputStream *)&stack0xffffffffffffffb8,(char *)ctx,(int)pPVar15);
          auVar3._8_8_ = 0;
          auVar3._0_8_ = extraout_RDX_00;
          pVar18 = (pair<const_char_*,_unsigned_int>)(auVar3 << 0x40);
          local_4c = local_48;
          ctx->depth_ = ctx->depth_ + -1;
        }
        if (pPVar15 == (ParseContext *)0x0) {
LAB_002a6b6f:
          p_00 = (ushort *)0x0;
        }
        else {
          iVar7 = ctx->depth_;
          aVar13 = local_68;
          p_00 = (ushort *)
                 ParseLoopPreserveNone(msg_00,(char *)pPVar15,ctx,(TcParseTableBase *)local_68);
          uVar12 = extraout_RDX_01;
          if (p_00 != (ushort *)0x0) {
            pPVar15 = (ParseContext *)(long)ctx->depth_;
            if (iVar7 == ctx->depth_) {
              psVar11 = (string *)0x0;
            }
            else {
              psVar11 = absl::lts_20240722::log_internal::MakeCheckOpString<long,long>
                                  ((long)iVar7,(long)pPVar15,"old_depth == depth_");
              uVar12 = extraout_RDX_02;
            }
            if (psVar11 != (string *)0x0) {
              MpRepeatedMessageOrGroup<true,false>();
              goto LAB_002a6d42;
            }
          }
          ctx->depth_ = ctx->depth_ + 1;
          uVar6 = (ctx->super_EpsCopyInputStream).limit_ + local_4c;
          auVar4._8_8_ = 0;
          auVar4._0_8_ = uVar12;
          pVar18 = (pair<const_char_*,_unsigned_int>)(auVar4 << 0x40);
          (ctx->super_EpsCopyInputStream).limit_ = uVar6;
          ptr_00 = pPVar15;
          if ((ctx->super_EpsCopyInputStream).last_tag_minus_1_ != 0) goto LAB_002a6b6f;
          aVar13._0_4_ = (int)uVar6 >> 0x1f & uVar6;
          aVar13.data._4_4_ = 0;
          pcVar10 = (ctx->super_EpsCopyInputStream).buffer_end_ + (int)aVar13._0_4_;
          pVar18._8_8_ = uVar12;
          pVar18.first = pcVar10;
          (ctx->super_EpsCopyInputStream).limit_end_ = pcVar10;
        }
        pPVar15 = pVar18._8_8_;
        if (p_00 == (ushort *)0x0) {
          iVar7 = 8;
        }
        else if (p_00 < (ctx->super_EpsCopyInputStream).limit_end_) {
          uVar17 = (uint)(byte)*p_00;
          ptr = (char *)((long)p_00 + 1);
          if ((char)(byte)*p_00 < '\0') {
            bVar1 = *ptr;
            auVar5._8_8_ = 0;
            auVar5._0_8_ = pPVar15;
            pVar18 = (pair<const_char_*,_unsigned_int>)(auVar5 << 0x40);
            aVar13.data = (ulong)bVar1 << 7;
            uVar17 = (uVar17 + (uint)bVar1 * 0x80) - 0x80;
            if ((char)bVar1 < '\0') {
              ptr_00 = (ParseContext *)(ulong)uVar17;
              pVar18 = ReadTagFallback((char *)p_00,uVar17);
              ptr = pVar18.first;
              uVar17 = pVar18.second;
            }
            else {
              ptr = (char *)(p_00 + 1);
            }
          }
          pPVar15 = pVar18._8_8_;
          iVar7 = (uint)((ushort *)ptr == (ushort *)0x0) << 3;
        }
        else {
          iVar7 = 9;
        }
        if (iVar7 != 0) {
          if (iVar7 == 8) {
            pcVar10 = Error(msg,(char *)ptr_00,pPVar15,(TcFieldData)aVar13,table,hasbits);
            return pcVar10;
          }
          goto LAB_002a6c77;
        }
      } while (uVar17 == data.field_0._0_4_);
      if ((ctx->super_EpsCopyInputStream).limit_end_ <= p_00) {
LAB_002a6c77:
        if ((ulong)table->has_bits_offset != 0) {
          puVar14 = (uint *)((long)&msg->_vptr_MessageLite + (ulong)table->has_bits_offset);
          if (((ulong)puVar14 & 3) != 0) {
LAB_002a6d30:
            AlignFail();
          }
          *puVar14 = *puVar14 | (uint)hasbits;
        }
        return (char *)p_00;
      }
      uVar17 = (uint)table->fast_idx_mask & (uint)*p_00;
      if ((uVar17 & 7) == 0) {
        uVar12 = (ulong)(uVar17 & 0xfffffff8);
        data.field_0 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)
                       ((ulong)*p_00 ^ *(ulong *)(&table[1].fast_idx_mask + uVar12 * 2));
        UNRECOVERED_JUMPTABLE = *(TailCallParseFunc *)(&table[1].has_bits_offset + uVar12);
        ptr = (char *)p_00;
        goto LAB_002a6c06;
      }
      goto LAB_002a6d5c;
    }
  }
  else {
LAB_002a6d42:
    MpRepeatedMessageOrGroup<true,false>();
  }
  MpRepeatedMessageOrGroup<true,false>();
LAB_002a6d5c:
  protobuf_assumption_failed
            ("(idx & 7) == 0",
             "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O1/_deps/protobuf-src/src/google/protobuf/generated_message_tctable_impl.h"
             ,0x44d);
}

Assistant:

const char* TcParser::MpRepeatedMessageOrGroup(PROTOBUF_TC_PARAM_DECL) {
  const auto& entry = RefAt<FieldEntry>(table, data.entry_offset());
  const uint16_t type_card = entry.type_card;
  ABSL_DCHECK_EQ(type_card & field_layout::kFcMask,
                 static_cast<uint16_t>(field_layout::kFcRepeated));
  const uint32_t decoded_tag = data.tag();
  const uint32_t decoded_wiretype = decoded_tag & 7;

  // Validate wiretype:
  if (!is_group) {
    ABSL_DCHECK_EQ(type_card & field_layout::kRepMask,
                   static_cast<uint16_t>(field_layout::kRepMessage));
    if (decoded_wiretype != WireFormatLite::WIRETYPE_LENGTH_DELIMITED) {
      PROTOBUF_MUSTTAIL return table->fallback(PROTOBUF_TC_PARAM_PASS);
    }
  } else {
    ABSL_DCHECK_EQ(type_card & field_layout::kRepMask,
                   static_cast<uint16_t>(field_layout::kRepGroup));
    if (decoded_wiretype != WireFormatLite::WIRETYPE_START_GROUP) {
      PROTOBUF_MUSTTAIL return table->fallback(PROTOBUF_TC_PARAM_PASS);
    }
  }

  void* const base = MaybeGetSplitBase(msg, is_split, table);
  RepeatedPtrFieldBase& field =
      MaybeCreateRepeatedRefAt<RepeatedPtrFieldBase, is_split>(
          base, entry.offset, msg);
  const TcParseTableBase* inner_table =
      GetTableFromAux(type_card, *table->field_aux(&entry));

  const char* ptr2 = ptr;
  uint32_t next_tag;
  do {
    MessageLite* value = AddMessage(inner_table, field);
    const auto inner_loop = [&](const char* ptr) {
      return ParseLoopPreserveNone(value, ptr, ctx, inner_table);
    };
    ptr = is_group ? ctx->ParseGroupInlined(ptr2, decoded_tag, inner_loop)
                   : ctx->ParseLengthDelimitedInlined(ptr2, inner_loop);
    if (PROTOBUF_PREDICT_FALSE(ptr == nullptr)) goto error;
    if (PROTOBUF_PREDICT_FALSE(!ctx->DataAvailable(ptr))) goto parse_loop;
    ptr2 = ReadTag(ptr, &next_tag);
    if (PROTOBUF_PREDICT_FALSE(ptr2 == nullptr)) goto error;
  } while (next_tag == decoded_tag);
  PROTOBUF_MUSTTAIL return ToTagDispatch(PROTOBUF_TC_PARAM_NO_DATA_PASS);
parse_loop:
  PROTOBUF_MUSTTAIL return ToParseLoop(PROTOBUF_TC_PARAM_NO_DATA_PASS);
error:
  PROTOBUF_MUSTTAIL return Error(PROTOBUF_TC_PARAM_NO_DATA_PASS);
}